

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

Vec_Wrd_t * Abc_SuppReadMin(char *pFileName,int *pnVars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *__haystack;
  char *pcVar4;
  size_t sVar5;
  char *pStr;
  char *pStart;
  char *pToken;
  char *pCur;
  uint local_38;
  int iVar;
  int nVars;
  int nCubes;
  word uCube;
  Vec_Wrd_t *vRes;
  int *pnVars_local;
  char *pFileName_local;
  
  local_38 = 0xffffffff;
  __haystack = Extra_FileReadContents(pFileName);
  if (__haystack == (char *)0x0) {
    printf("Cannot open input file (%s).\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pcVar4 = strstr(__haystack,"INPUT F-COVER");
    if (pcVar4 == (char *)0x0) {
      printf("Cannot find beginning of cube cover (%s).\n","INPUT F-COVER");
      pFileName_local = (char *)0x0;
    }
    else {
      sVar5 = strlen("INPUT F-COVER");
      pcVar4 = strtok(pcVar4 + sVar5," \t\r\n,");
      uVar1 = atoi(pcVar4);
      if (((int)uVar1 < 1) || (1000000 < (int)uVar1)) {
        printf("The number of cubes in not in the range [1; 1000000].\n");
        pFileName_local = (char *)0x0;
      }
      else {
        pFileName_local = (char *)Vec_WrdAlloc(1000);
        _nVars = 0;
        pCur._4_4_ = 0;
        while (pcVar4 = strtok((char *)0x0," \t\r\n,"), pcVar4 != (char *)0x0) {
          sVar5 = strlen(pcVar4);
          if (sVar5 < 3) {
            if ((pcVar4[1] == '0') && (*pcVar4 == '1')) {
              _nVars = 1L << ((byte)pCur._4_4_ & 0x3f) | _nVars;
            }
            else if ((pcVar4[1] != '1') || (*pcVar4 != '0')) {
              printf("Strange literal representation (%s) of cube %d.\n",pcVar4,(ulong)uVar1);
              Vec_WrdFree((Vec_Wrd_t *)pFileName_local);
              return (Vec_Wrd_t *)0x0;
            }
            pCur._4_4_ = pCur._4_4_ + 1;
          }
          else {
            iVar2 = strncmp(pcVar4,"INPUT",5);
            if (iVar2 == 0) break;
            if (0x40 < (int)pCur._4_4_) {
              printf("The number of inputs (%d) is too high.\n",(ulong)pCur._4_4_);
              Vec_WrdFree((Vec_Wrd_t *)pFileName_local);
              return (Vec_Wrd_t *)0x0;
            }
            if (local_38 == 0xffffffff) {
              local_38 = pCur._4_4_;
            }
            else if (local_38 != pCur._4_4_) {
              printf("The number of inputs (%d) does not match declaration (%d).\n",(ulong)local_38,
                     (ulong)pCur._4_4_);
              Vec_WrdFree((Vec_Wrd_t *)pFileName_local);
              return (Vec_Wrd_t *)0x0;
            }
            Vec_WrdPush((Vec_Wrd_t *)pFileName_local,_nVars);
            _nVars = 0;
            pCur._4_4_ = 0;
          }
        }
        if (__haystack != (char *)0x0) {
          free(__haystack);
        }
        uVar3 = Vec_WrdSize((Vec_Wrd_t *)pFileName_local);
        if (uVar3 == uVar1) {
          printf("Successfully parsed function with %d inputs and %d cubes.\n",(ulong)local_38,
                 (ulong)uVar1);
          *pnVars = local_38;
        }
        else {
          uVar3 = Vec_WrdSize((Vec_Wrd_t *)pFileName_local);
          printf("The number of cubes (%d) does not match declaration (%d).\n",(ulong)uVar3,
                 (ulong)uVar1);
          Vec_WrdFree((Vec_Wrd_t *)pFileName_local);
          pFileName_local = (char *)0x0;
        }
      }
    }
  }
  return (Vec_Wrd_t *)pFileName_local;
}

Assistant:

Vec_Wrd_t * Abc_SuppReadMin( char * pFileName, int * pnVars )
{
    Vec_Wrd_t * vRes; word uCube;
    int nCubes = 0, nVars = -1, iVar;
    char * pCur, * pToken, * pStart = "INPUT F-COVER";
    char * pStr = Extra_FileReadContents( pFileName );
    if ( pStr == NULL )
        { printf( "Cannot open input file (%s).\n", pFileName ); return NULL; }
    pCur = strstr( pStr, pStart );
    if ( pCur == NULL )
        { printf( "Cannot find beginning of cube cover (%s).\n", pStart ); return NULL; }
    pToken = strtok( pCur + strlen(pStart), " \t\r\n," );
    nCubes = atoi( pToken );
    if ( nCubes < 1 || nCubes > 1000000 )
        { printf( "The number of cubes in not in the range [1; 1000000].\n" ); return NULL; }
    vRes = Vec_WrdAlloc( 1000 );
    uCube = 0; iVar = 0;
    while ( (pToken = strtok(NULL, " \t\r\n,")) != NULL )
    {
        if ( strlen(pToken) > 2 )
        {
            if ( !strncmp(pToken, "INPUT", strlen("INPUT")) )
                break;
            if ( iVar > 64 )
                { printf( "The number of inputs (%d) is too high.\n", iVar ); Vec_WrdFree(vRes); return NULL; }
            if ( nVars == -1 )
                nVars = iVar;
            else if ( nVars != iVar )
                { printf( "The number of inputs (%d) does not match declaration (%d).\n", nVars, iVar ); Vec_WrdFree(vRes); return NULL; }
            Vec_WrdPush( vRes, uCube );
            uCube = 0; iVar = 0;
            continue;
        }
        if ( pToken[1] == '0' && pToken[0] == '1' ) // value 1
            uCube |= (((word)1) << iVar);
        else if ( pToken[1] != '1' || pToken[0] != '0' ) // value 0
            { printf( "Strange literal representation (%s) of cube %d.\n", pToken, nCubes ); Vec_WrdFree(vRes); return NULL; }
        iVar++;
    }
    ABC_FREE( pStr );
    if ( Vec_WrdSize(vRes) != nCubes )
        { printf( "The number of cubes (%d) does not match declaration (%d).\n", Vec_WrdSize(vRes), nCubes ); Vec_WrdFree(vRes); return NULL; }
    else
        printf( "Successfully parsed function with %d inputs and %d cubes.\n", nVars, nCubes );
    *pnVars = nVars;
    return vRes;
}